

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.c
# Opt level: O0

U32 HUF_selectDecoder(size_t dstSize,size_t cSrcSize)

{
  int iVar1;
  uint uVar2;
  uint local_2c;
  U32 DTime1;
  U32 DTime0;
  U32 D256;
  U32 Q;
  size_t cSrcSize_local;
  size_t dstSize_local;
  
  if (dstSize == 0) {
    __assert_fail("dstSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                  ,0x6e1,"U32 HUF_selectDecoder(size_t, size_t)");
  }
  if (dstSize < 0x20001) {
    if (cSrcSize < dstSize) {
      local_2c = (uint)((cSrcSize << 4) / dstSize);
    }
    else {
      local_2c = 0xf;
    }
    iVar1 = (int)(dstSize >> 8);
    uVar2 = algoTime[local_2c][1].tableTime + algoTime[local_2c][1].decode256Time * iVar1;
    return (U32)((uVar2 >> 5) + uVar2 <
                algoTime[local_2c][0].tableTime + algoTime[local_2c][0].decode256Time * iVar1);
  }
  __assert_fail("dstSize <= 128*1024",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                ,0x6e2,"U32 HUF_selectDecoder(size_t, size_t)");
}

Assistant:

U32 HUF_selectDecoder (size_t dstSize, size_t cSrcSize)
{
    assert(dstSize > 0);
    assert(dstSize <= 128*1024);
#if defined(HUF_FORCE_DECOMPRESS_X1)
    (void)dstSize;
    (void)cSrcSize;
    return 0;
#elif defined(HUF_FORCE_DECOMPRESS_X2)
    (void)dstSize;
    (void)cSrcSize;
    return 1;
#else
    /* decoder timing evaluation */
    {   U32 const Q = (cSrcSize >= dstSize) ? 15 : (U32)(cSrcSize * 16 / dstSize);   /* Q < 16 */
        U32 const D256 = (U32)(dstSize >> 8);
        U32 const DTime0 = algoTime[Q][0].tableTime + (algoTime[Q][0].decode256Time * D256);
        U32 DTime1 = algoTime[Q][1].tableTime + (algoTime[Q][1].decode256Time * D256);
        DTime1 += DTime1 >> 5;  /* small advantage to algorithm using less memory, to reduce cache eviction */
        return DTime1 < DTime0;
    }
#endif
}